

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,mrg5 *R)

{
  undefined4 uVar1;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  long lVar3;
  status_type S_new;
  parameter_type P_new;
  delim_c local_6c;
  delim_c local_6b;
  delim_c local_6a;
  delim_c local_69;
  delim_str local_68;
  mrg_status<int,_5,_trng::mrg5> local_5c;
  mrg_parameter<int,_5,_trng::mrg5> local_48;
  
  local_48.a[0] = 0;
  local_48.a[1] = 0;
  local_48.a[2] = 0;
  local_48.a[3] = 0;
  local_48.a[4] = 0;
  mrg_status<int,_5,_trng::mrg5>::mrg_status(&local_5c);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_68);
  local_69.c = '[';
  pbVar2 = utility::operator>>(in,&local_69);
  local_68.str = mrg5::name();
  pbVar2 = utility::operator>>(pbVar2,&local_68);
  local_6a.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_6a);
  pbVar2 = operator>>(pbVar2,&local_48);
  local_6b.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_6b);
  pbVar2 = operator>>(pbVar2,&local_5c);
  local_6c.c = ']';
  utility::operator>>(pbVar2,&local_6c);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    (R->P).a[4] = local_48.a[4];
    *(undefined8 *)(R->P).a = local_48.a._0_8_;
    *(undefined8 *)((R->P).a + 2) = local_48.a._8_8_;
    (R->S).r[4] = local_5c.r[4];
    *(undefined8 *)(R->S).r = local_5c.r._0_8_;
    *(undefined8 *)((R->S).r + 2) = local_5c.r._8_8_;
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg5 &R) {
      mrg5::parameter_type P_new;
      mrg5::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg5::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }